

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O0

_Bool gear_excise_object(player *p,object *obj)

{
  byte bVar1;
  int16_t iVar2;
  object *poVar3;
  wchar_t local_1c;
  wchar_t i;
  object *obj_local;
  player *p_local;
  
  pile_excise(&p->gear_k,obj->known);
  pile_excise(&p->gear,obj);
  bVar1 = obj->number;
  iVar2 = object_weight_one(obj);
  p->upkeep->total_weight = p->upkeep->total_weight - (uint)bVar1 * (int)iVar2;
  for (local_1c = L'\0'; local_1c < (int)(uint)(p->body).count; local_1c = local_1c + L'\x01') {
    poVar3 = slot_object(p,local_1c);
    if (poVar3 == obj) {
      (p->body).slots[local_1c].obj = (object *)0x0;
      p->upkeep->equip_cnt = p->upkeep->equip_cnt + L'\xffffffff';
    }
  }
  calc_inventory(p);
  p->upkeep->update = p->upkeep->update | 1;
  p->upkeep->notice = p->upkeep->notice | 1;
  p->upkeep->redraw = p->upkeep->redraw | 0x60000;
  return true;
}

Assistant:

static bool gear_excise_object(struct player *p, struct object *obj)
{
	int i;

	pile_excise(&p->gear_k, obj->known);
	pile_excise(&p->gear, obj);

	/* Change the weight */
	p->upkeep->total_weight -= obj->number * object_weight_one(obj);

	/* Make sure it isn't still equipped */
	for (i = 0; i < p->body.count; i++) {
		if (slot_object(p, i) == obj) {
			p->body.slots[i].obj = NULL;
			p->upkeep->equip_cnt--;
		}
	}

	/* Update the gear */
	calc_inventory(p);

	/* Housekeeping */
	p->upkeep->update |= (PU_BONUS);
	p->upkeep->notice |= (PN_COMBINE);
	p->upkeep->redraw |= (PR_INVEN | PR_EQUIP);

	return true;
}